

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O3

string * __thiscall
enact::AstSerialise::visitSwitchExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,SwitchExpr *expr)

{
  undefined1 *puVar1;
  string *psVar2;
  Expr *pEVar3;
  _Head_base<0UL,_enact::Pattern_*,_false> _Var4;
  BlockExpr *pBVar5;
  ostream *poVar6;
  pointer pSVar7;
  stringstream s;
  long *local_210;
  long local_208;
  long local_200 [2];
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  string *local_1d0;
  undefined1 *local_1c8;
  pointer local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(Expr::Switch ",0xe);
  puVar1 = &this->field_0x8;
  pEVar3 = (expr->value)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar3->_vptr_Expr[2])(&local_210,pEVar3,puVar1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_210,local_208);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," (\n",3);
  psVar2 = &this->m_ident;
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  std::__cxx11::string::append((char *)psVar2);
  pSVar7 = (expr->cases).super__Vector_base<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_1c0 = (expr->cases).
              super__Vector_base<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_1d0 = __return_storage_ptr__;
  if (pSVar7 != local_1c0) {
    local_1c8 = &this->field_0x10;
    do {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->m_ident)._M_dataplus._M_p,
                          (this->m_ident)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
      _Var4._M_head_impl =
           (pSVar7->pattern)._M_t.
           super___uniq_ptr_impl<enact::Pattern,_std::default_delete<enact::Pattern>_>._M_t.
           super__Tuple_impl<0UL,_enact::Pattern_*,_std::default_delete<enact::Pattern>_>.
           super__Head_base<0UL,_enact::Pattern_*,_false>._M_head_impl;
      (*(_Var4._M_head_impl)->_vptr_Pattern[2])(&local_210,_Var4._M_head_impl,local_1c8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_210,local_208);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pEVar3 = (pSVar7->predicate)._M_t.
               super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
               super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
               super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
      (*pEVar3->_vptr_Expr[2])(&local_1f0,pEVar3,puVar1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_1f0,local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," (\n",3);
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
      std::__cxx11::string::append((char *)psVar2);
      pBVar5 = (pSVar7->body)._M_t.
               super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
               super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
               super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
      (*(pBVar5->super_Expr)._vptr_Expr[2])(&local_210,pBVar5,puVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_210,local_208);
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
      std::__cxx11::string::erase((ulong)psVar2,0);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->m_ident)._M_dataplus._M_p,
                          (this->m_ident)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != local_1c0);
  }
  std::__cxx11::string::erase((ulong)psVar2,0);
  psVar2 = local_1d0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string AstSerialise::visitSwitchExpr(SwitchExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::Switch " << visitExpr(*expr.value) << " (\n";
        m_ident += "    ";

        for (auto &case_ : expr.cases) {
            s << m_ident << "(" << visitPattern(*case_.pattern) << " " <<
                    visitExpr(*case_.predicate) << " (\n";
            m_ident += "    ";

            s << visitExpr(*case_.body);

            m_ident.erase(0, 4);
            s << m_ident << ")\n";
        }

        m_ident.erase(0, 4);
        s << m_ident << ")";

        return s.str();
    }